

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O3

periodic_task_handle_conflict
libcmepoll_LTX_add_delayed_task
          (CMtrans_services_conflict svc,select_data_ptr *sdp,int delay_sec,int delay_usec,
          select_list_func func,void *arg1,void *arg2)

{
  int iVar1;
  periodic_task_handle_conflict p_Var2;
  ulong uVar3;
  long lVar4;
  select_data_ptr psVar5;
  
  psVar5 = *sdp;
  p_Var2 = (periodic_task_handle_conflict)malloc(0x40);
  if (psVar5 == (select_data_ptr)0x0) {
    init_select_data(svc,sdp,(CManager)0x0);
    psVar5 = *sdp;
  }
  if (psVar5->cm != (CManager)0x0) {
    iVar1 = (*svc->return_CM_lock_status)
                      (psVar5->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                       ,0x28c);
    if (iVar1 == 0) {
      printf("%s:%u: failed assertion `%s\'\n",
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
             ,0x28c,"CM_LOCKED(svc, sd->cm)");
      abort();
    }
  }
  p_Var2->period_sec = 0;
  p_Var2->period_usec = 0;
  p_Var2->executing = 0xffffffffffffffff;
  gettimeofday((timeval *)&p_Var2->next_time,(__timezone_ptr_t)0x0);
  uVar3 = (long)delay_usec + (p_Var2->next_time).tv_usec;
  (p_Var2->next_time).tv_usec = uVar3;
  lVar4 = (long)delay_sec + (p_Var2->next_time).tv_sec;
  (p_Var2->next_time).tv_sec = lVar4;
  if (999999 < (long)uVar3) {
    (p_Var2->next_time).tv_sec = lVar4 + uVar3 / 1000000;
    (p_Var2->next_time).tv_usec = uVar3 % 1000000;
  }
  p_Var2->func = func;
  p_Var2->arg1 = arg1;
  p_Var2->arg2 = arg2;
  p_Var2->next = psVar5->periodic_task_list;
  psVar5->periodic_task_list = p_Var2;
  wake_server_thread((select_data_ptr)(ulong)(uint)psVar5->wake_write_fd);
  return p_Var2;
}

Assistant:

extern periodic_task_handle
libcmepoll_LTX_add_delayed_task(CMtrans_services svc, select_data_ptr *sdp, int delay_sec, int delay_usec, select_list_func func, void *arg1, void *arg2)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    periodic_task_handle handle = malloc(sizeof(struct _periodic_task));
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    handle->period_sec = 0;
    handle->period_usec = 0;
    handle->executing = (thr_thread_t) -1;
#ifndef HAVE_WINDOWS_H
    gettimeofday(&handle->next_time, NULL);
#else
    {
	/* GSE...  No gettimeofday on windows.  
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */
	struct _timeb nowb;
	_ftime(&nowb);
	handle->next_time.tv_sec = nowb.time;
	handle->next_time.tv_usec = nowb.millitm * 1000;
    }
#endif
    increment_time(&handle->next_time, delay_sec, delay_usec);
    handle->func = func;
    handle->arg1 = arg1;
    handle->arg2 = arg2;
    handle->next = NULL;

    if (sd->periodic_task_list == NULL) {
	sd->periodic_task_list = handle;
    } else {
	handle->next = sd->periodic_task_list;
	sd->periodic_task_list = handle;
    }
    wake_server_thread(sd);
    return handle;
}